

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4random.c
# Opt level: O0

void arc4random_buf(void *buf_,size_t n)

{
  uchar uVar1;
  uchar *buf;
  size_t n_local;
  void *buf__local;
  
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  arc4_stir_if_needed();
  buf = (uchar *)n;
  while( true ) {
    if (buf == (uchar *)0x0) break;
    arc4_count = arc4_count + -1;
    if (arc4_count < 1) {
      arc4_stir();
    }
    uVar1 = arc4_getbyte();
    *(uchar *)((long)buf_ + (long)(buf + -1)) = uVar1;
    buf = buf + -1;
  }
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
  }
  return;
}

Assistant:

ARC4RANDOM_EXPORT void
arc4random_buf(void *buf_, size_t n)
{
	unsigned char *buf = buf_;
	ARC4_LOCK_();
	arc4_stir_if_needed();
	while (n--) {
		if (--arc4_count <= 0)
			arc4_stir();
		buf[n] = arc4_getbyte();
	}
	ARC4_UNLOCK_();
}